

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O3

uint64_t __thiscall
fmp4_stream::ingest_stream::get_init_segment_data
          (ingest_stream *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *init_seg_dat)

{
  pointer puVar1;
  size_t sVar2;
  size_type __new_size;
  
  __new_size = (this->init_fragment_).moov_box_.large_size_ +
               (this->init_fragment_).ftyp_box_.large_size_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(init_seg_dat,__new_size);
  puVar1 = (this->init_fragment_).ftyp_box_.box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar2 = (long)(this->init_fragment_).ftyp_box_.box_data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (sVar2 != 0) {
    memmove((init_seg_dat->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
            _M_impl.super__Vector_impl_data._M_start,puVar1,sVar2);
  }
  puVar1 = (this->init_fragment_).moov_box_.box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar2 = (long)(this->init_fragment_).moov_box_.box_data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (sVar2 != 0) {
    memmove((init_seg_dat->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
            _M_impl.super__Vector_impl_data._M_start + (this->init_fragment_).ftyp_box_.large_size_,
            puVar1,sVar2);
  }
  return __new_size;
}

Assistant:

uint64_t ingest_stream::get_init_segment_data(std::vector<uint8_t> &init_seg_dat)
	{
		uint64_t ssize = init_fragment_.ftyp_box_.large_size_ + init_fragment_.moov_box_.large_size_;
		init_seg_dat.resize(ssize);

		// hard copy the init segment data to the output vector, as ftyp and moviefragment box need to be combined
		std::copy(init_fragment_.ftyp_box_.box_data_.begin(), 
			      init_fragment_.ftyp_box_.box_data_.end(), 
			      init_seg_dat.begin()
	    );
		std::copy(init_fragment_.moov_box_.box_data_.begin(), 
			      init_fragment_.moov_box_.box_data_.end(), 
			      init_seg_dat.begin() + init_fragment_.ftyp_box_.large_size_
		);

		return ssize;
	}